

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O0

size_t HUF_decompress1X1_DCtx_wksp_bmi2
                 (HUF_DTable *dctx,void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,
                 void *workSpace,size_t wkspSize,int bmi2)

{
  uint uVar1;
  size_t hSize;
  BYTE *ip;
  void *workSpace_local;
  size_t cSrcSize_local;
  void *cSrc_local;
  size_t dstSize_local;
  void *dst_local;
  HUF_DTable *dctx_local;
  
  dctx_local = (HUF_DTable *)HUF_readDTableX1_wksp(dctx,cSrc,cSrcSize,workSpace,wkspSize);
  uVar1 = ERR_isError((size_t)dctx_local);
  if (uVar1 == 0) {
    if (dctx_local < cSrcSize) {
      dctx_local = (HUF_DTable *)
                   HUF_decompress1X1_usingDTable_internal
                             (dst,dstSize,(void *)((long)dctx_local + (long)cSrc),
                              cSrcSize - (long)dctx_local,dctx,bmi2);
    }
    else {
      dctx_local = (HUF_DTable *)0xffffffffffffffb8;
    }
  }
  return (size_t)dctx_local;
}

Assistant:

size_t HUF_decompress1X1_DCtx_wksp_bmi2(HUF_DTable* dctx, void* dst, size_t dstSize, const void* cSrc, size_t cSrcSize, void* workSpace, size_t wkspSize, int bmi2)
{
    const BYTE* ip = (const BYTE*) cSrc;

    size_t const hSize = HUF_readDTableX1_wksp(dctx, cSrc, cSrcSize, workSpace, wkspSize);
    if (HUF_isError(hSize)) return hSize;
    if (hSize >= cSrcSize) return ERROR(srcSize_wrong);
    ip += hSize; cSrcSize -= hSize;

    return HUF_decompress1X1_usingDTable_internal(dst, dstSize, ip, cSrcSize, dctx, bmi2);
}